

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-cups.cpp
# Opt level: O0

cups_t * read_input_abi_cxx11_(cups_t *__return_storage_ptr__,string_view input)

{
  back_insert_iterator<std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> bVar1;
  size_t local_20;
  string_view input_local;
  cups_t *cups;
  
  input_local._M_len = (size_t)input._M_str;
  local_20 = input._M_len;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node._M_size = 0;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(__return_storage_ptr__);
  bVar1 = std::back_inserter<std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>
                    (__return_storage_ptr__);
  std::ranges::__transform_fn::
  operator()<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::back_insert_iterator<std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day23_crab_cups_cpp:29:54),_std::identity>
            ((__transform_fn *)&std::ranges::transform,&local_20,bVar1.container);
  return __return_storage_ptr__;
}

Assistant:

auto read_input(std::string_view input) {
  auto cups = cups_t {};
  ranges::transform(input, std::back_inserter(cups), [](char ch){
    return std::stoull(std::string{ch});
  });
  return cups;
}